

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall wabt::interp::Memory::Grow(Memory *this,u64 count)

{
  Limits *pLVar1;
  ulong uVar2;
  ulong uVar3;
  u64 uVar4;
  
  uVar2 = (this->type_).limits.max;
  uVar3 = this->pages_;
  if (uVar3 <= uVar2 - count && count <= uVar2) {
    pLVar1 = &(this->type_).limits;
    pLVar1->initial = pLVar1->initial + count;
    uVar4 = uVar3 + count;
    this->pages_ = uVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,uVar4 * 0x10000)
    ;
    return (Result)Ok;
  }
  return (Result)Error;
}

Assistant:

Result Memory::Grow(u64 count) {
  u64 new_pages;
  if (CanGrow<u64>(type_.limits, pages_, count, &new_pages)) {
    // Grow the limits of the memory too, so that if it is used as an
    // import to another module its new size is honored.
    type_.limits.initial += count;
#if WABT_BIG_ENDIAN
    auto old_size = data_.size();
#endif
    pages_ = new_pages;
    data_.resize(new_pages * WABT_PAGE_SIZE);
#if WABT_BIG_ENDIAN
    std::move_backward(data_.begin(), data_.begin() + old_size, data_.end());
    std::fill(data_.begin(), data_.end() - old_size, 0);
#endif
    return Result::Ok;
  }
  return Result::Error;
}